

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_smooth.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint time_iter;
  uint space_iter;
  uint uVar1;
  double *results [8];
  Gas_parameters gas_parameters;
  Iterative_Method_parameters method_parameters;
  
  initialize_iterative_algorithm_parameters(&method_parameters,argc,argv);
  print_iterative_algorithm_info(&method_parameters);
  gas_parameters_Initialize(&gas_parameters);
  results_Construct(results,0x10);
  uVar1 = 0;
  for (time_iter = 0; time_iter != 4; time_iter = time_iter + 1) {
    for (space_iter = 0; space_iter != 4; space_iter = space_iter + 1) {
      process_iteration(&method_parameters,&gas_parameters,time_iter,space_iter,space_iter + uVar1,
                        results);
    }
    uVar1 = space_iter + uVar1;
  }
  export_results(results,0x10);
  results_Destruct(results);
  return 0;
}

Assistant:

int main (int argc, char * argv[])
{
  Iterative_Method_parameters method_parameters;
  Gas_parameters gas_parameters;

  double * results[RESULTS_SIZE];
  unsigned global_iter = 0,
           time_iter   = 0,
           space_iter  = 0;

  /* Initialize global structures */
  initialize_iterative_algorithm_parameters (&method_parameters, argc, argv);
  print_iterative_algorithm_info (&method_parameters);
  gas_parameters_Initialize (&gas_parameters);
  results_Construct (results, time_maxiter * space_maxiter);

  /* The main loop */
  for (time_iter = 0; time_iter < time_maxiter; time_iter++) {
    for (space_iter = 0; space_iter < space_maxiter; space_iter++) {
      process_iteration(&method_parameters, &gas_parameters,
                        time_iter, space_iter, global_iter, results);
      global_iter++;
    }
  }

  /* Export results and cleanup */
  export_results (results, time_maxiter * space_maxiter);
  results_Destruct (results);

  return 0;
}